

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationSigmoidHard * __thiscall
CoreML::Specification::ActivationParams::mutable_sigmoidhard(ActivationParams *this)

{
  ActivationSigmoidHard *this_00;
  
  if (this->_oneof_case_[0] == 0x29) {
    this_00 = (ActivationSigmoidHard *)(this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x29;
    this_00 = (ActivationSigmoidHard *)operator_new(0x20);
    ActivationSigmoidHard::ActivationSigmoidHard(this_00);
    (this->NonlinearityType_).sigmoidhard_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationSigmoidHard* ActivationParams::mutable_sigmoidhard() {
  if (!has_sigmoidhard()) {
    clear_NonlinearityType();
    set_has_sigmoidhard();
    NonlinearityType_.sigmoidhard_ = new ::CoreML::Specification::ActivationSigmoidHard;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.sigmoidHard)
  return NonlinearityType_.sigmoidhard_;
}